

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O0

void __thiscall
cmParseCoberturaCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  cmCTest *pcVar1;
  string_view prefix;
  string_view str;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  reference this_00;
  ulong uVar8;
  mapped_type *this_01;
  reference pvVar9;
  FileLinesType *curFileLines_1;
  int curHits;
  int curNumber;
  int tagCount_1;
  FileLinesType *curFileLines;
  string line;
  string local_670 [32];
  undefined1 local_650 [8];
  ostringstream cmCTestLog_msg_1;
  string local_4d8;
  undefined1 local_4b8 [8];
  ifstream fin;
  string local_2b0;
  reference local_290;
  string *filePath_1;
  iterator __end7;
  iterator __begin7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range7;
  string *filePath;
  iterator __end6;
  iterator __begin6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  undefined1 local_228 [8];
  string filename;
  undefined1 local_1e8 [8];
  ostringstream cmCTestLog_msg;
  int local_70;
  int tagCount;
  undefined1 local_60 [8];
  string finalpath;
  string FoundSource;
  char **atts_local;
  string *name_local;
  XMLParser *this_local;
  
  std::__cxx11::string::string((string *)(finalpath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  bVar2 = std::operator==(name,"source");
  if (bVar2) {
    this->InSource = true;
    goto LAB_003b4947;
  }
  bVar2 = std::operator==(name,"sources");
  if (bVar2) {
    this->InSources = true;
    goto LAB_003b4947;
  }
  bVar2 = std::operator==(name,"class");
  if (!bVar2) {
    bVar2 = std::operator==(name,"line");
    if (bVar2) {
      curHits = 0;
      curFileLines_1._4_4_ = -1;
      curFileLines_1._0_4_ = -1;
      while ((this->SkipThisClass & 1U) == 0) {
        iVar5 = strcmp(atts[curHits],"hits");
        if (iVar5 == 0) {
          curFileLines_1._0_4_ = atoi(atts[curHits + 1]);
        }
        else {
          iVar5 = strcmp(atts[curHits],"number");
          if (iVar5 == 0) {
            curFileLines_1._4_4_ = atoi(atts[curHits + 1]);
          }
        }
        if ((-1 < (int)curFileLines_1) && (0 < curFileLines_1._4_4_)) {
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (this_01,(long)(curFileLines_1._4_4_ + -1));
          *pvVar9 = (int)curFileLines_1;
          break;
        }
        curHits = curHits + 1;
      }
    }
    goto LAB_003b4947;
  }
  local_70 = 0;
  while (iVar5 = strcmp(atts[local_70],"filename"), iVar5 != 0) {
    local_70 = local_70 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  poVar6 = std::operator<<((ostream *)local_1e8,"Reading file: ");
  poVar6 = std::operator<<(poVar6,atts[(long)local_70 + 1]);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
               ,0x3f,pcVar7,(bool)(this->Coverage->Quiet & 1));
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  pcVar7 = atts[(long)local_70 + 1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_228,pcVar7,(allocator<char> *)((long)&__range6 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range6 + 7));
  std::__cxx11::string::clear();
  __end6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->FilePaths);
  filePath = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->FilePaths);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end6,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&filePath), bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end6);
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_228)
    ;
    prefix = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    bVar2 = cmHasPrefix(str,prefix);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&this->CurFileName,(string *)local_228);
      break;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end6);
  }
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) != 0) {
    __end7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->FilePaths);
    filePath_1 = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->FilePaths);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end7,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&filePath_1), bVar2) {
      local_290 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end7);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&>
                (&local_2b0,local_290,(char (*) [2])0x12fb511,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      bVar2 = cmsys::SystemTools::FileExists((string *)local_60);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)&this->CurFileName,(string *)local_60);
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end7);
    }
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_4b8,pcVar7,_S_in);
  uVar8 = std::__cxx11::string::empty();
  if (((uVar8 & 1) == 0) &&
     (bVar3 = std::ios::operator!((ios *)(local_4b8 + (long)*(_func_int **)((long)local_4b8 + -0x18)
                                         )), (bVar3 & 1) == 0)) {
LAB_003b46d9:
    std::__cxx11::string::string((string *)&curFileLines);
    _tagCount_1 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
    while (bVar2 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_4b8,(string *)&curFileLines,(bool *)0x0,
                              0xffffffffffffffff), bVar2) {
      curNumber = -1;
      std::vector<int,_std::allocator<int>_>::push_back(_tagCount_1,&curNumber);
    }
    line.field_2._12_4_ = 3;
    std::__cxx11::string::~string((string *)&curFileLines);
  }
  else {
    cmStrCat<std::__cxx11::string&,char_const(&)[2],char_const*&>
              (&local_4d8,&this->Coverage->BinaryDir,(char (*) [2])0x12fb511,
               atts + (long)local_70 + 1);
    std::__cxx11::string::operator=((string *)&this->CurFileName,(string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    _Var4 = std::__cxx11::string::c_str();
    std::ifstream::open(local_4b8,_Var4);
    bVar3 = std::ios::operator!((ios *)(local_4b8 + (long)*(_func_int **)((long)local_4b8 + -0x18)))
    ;
    if ((bVar3 & 1) == 0) goto LAB_003b46d9;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
    poVar6 = std::operator<<((ostream *)local_650,"Skipping system file ");
    poVar6 = std::operator<<(poVar6,(string *)local_228);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
                 ,0x61,pcVar7,(bool)(this->Coverage->Quiet & 1));
    std::__cxx11::string::~string(local_670);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
    this->SkipThisClass = true;
    line.field_2._12_4_ = 3;
  }
  std::ifstream::~ifstream(local_4b8);
  std::__cxx11::string::~string((string *)local_228);
LAB_003b4947:
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(finalpath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    std::string FoundSource;
    std::string finalpath;
    if (name == "source") {
      this->InSource = true;
    } else if (name == "sources") {
      this->InSources = true;
    } else if (name == "class") {
      int tagCount = 0;
      while (true) {
        if (strcmp(atts[tagCount], "filename") == 0) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Reading file: " << atts[tagCount + 1]
                                              << std::endl,
                             this->Coverage.Quiet);
          std::string filename = atts[tagCount + 1];
          this->CurFileName.clear();

          // Check if this is an absolute path that falls within our
          // source or binary directories.
          for (std::string const& filePath : this->FilePaths) {
            if (cmHasPrefix(filename, filePath)) {
              this->CurFileName = filename;
              break;
            }
          }

          if (this->CurFileName.empty()) {
            // Check if this is a path that is relative to our source or
            // binary directories.
            for (std::string const& filePath : this->FilePaths) {
              finalpath = cmStrCat(filePath, "/", filename);
              if (cmSystemTools::FileExists(finalpath)) {
                this->CurFileName = finalpath;
                break;
              }
            }
          }

          cmsys::ifstream fin(this->CurFileName.c_str());
          if (this->CurFileName.empty() || !fin) {
            this->CurFileName =
              cmStrCat(this->Coverage.BinaryDir, "/", atts[tagCount + 1]);
            fin.open(this->CurFileName.c_str());
            if (!fin) {
              cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                                 "Skipping system file " << filename
                                                         << std::endl,
                                 this->Coverage.Quiet);

              this->SkipThisClass = true;
              break;
            }
          }
          std::string line;
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          while (cmSystemTools::GetLineFromStream(fin, line)) {
            curFileLines.push_back(-1);
          }

          break;
        }
        ++tagCount;
      }
    } else if (name == "line") {
      int tagCount = 0;
      int curNumber = -1;
      int curHits = -1;
      while (true) {
        if (this->SkipThisClass) {
          break;
        }
        if (strcmp(atts[tagCount], "hits") == 0) {
          curHits = atoi(atts[tagCount + 1]);
        } else if (strcmp(atts[tagCount], "number") == 0) {
          curNumber = atoi(atts[tagCount + 1]);
        }

        if (curHits > -1 && curNumber > 0) {
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          {
            curFileLines[curNumber - 1] = curHits;
          }
          break;
        }
        ++tagCount;
      }
    }
  }